

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Marray<float,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::operator=
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>,_float>
          *expression)

{
  CoordinateOrder CVar1;
  View<float,_true,_std::allocator<unsigned_long>_> *this_00;
  long lVar2;
  long *plVar3;
  bool bVar4;
  float *pfVar5;
  size_t sVar6;
  runtime_error *this_01;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong dimension;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_61;
  Marray<float,_std::allocator<unsigned_long>_> local_60;
  
  bVar4 = BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::DividedBy<float,float,float>>
          ::overlaps<float,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::DividedBy<float,float,float>>
                      *)expression,(View<float,_false,_std::allocator<unsigned_long>_> *)this);
  if (bVar4) {
    Marray<andres::BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::DividedBy<float,float,float>>,float>
              ((Marray<float,std::allocator<unsigned_long>> *)&local_60,expression,&local_61);
    Marray<float,_std::allocator<unsigned_long>_>::operator=
              ((Marray<float,_std::allocator<unsigned_long>_> *)this,&local_60);
    operator_delete(local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.data_,
                    local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                    size_ << 2);
    operator_delete(local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                    shape_,local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.
                           geometry_.dimension_ * 0x18);
  }
  else {
    if (*(long *)(this + 0x30) != *(long *)(*(long *)expression + 0x30)) {
      operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
      pfVar5 = __gnu_cxx::new_allocator<float>::allocate
                         ((new_allocator<float> *)(this + 0x40),
                          *(size_type *)(*(long *)expression + 0x30),(void *)0x0);
      *(float **)this = pfVar5;
    }
    sVar6 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
            ::dimension((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
                         *)expression);
    marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
              ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar6);
    sVar6 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
            ::dimension((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
                         *)expression);
    if (sVar6 != 0) {
      dimension = 0;
      do {
        sVar6 = View<float,_true,_std::allocator<unsigned_long>_>::shape
                          (*(View<float,_true,_std::allocator<unsigned_long>_> **)expression,
                           dimension);
        if (*(ulong *)(this + 0x28) <= dimension) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Assertion failed.");
          goto LAB_00147844;
        }
        *(size_t *)(*(long *)(this + 0x10) + dimension * 8) = sVar6;
        dimension = dimension + 1;
        sVar6 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
                ::dimension((BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::DividedBy<float,_float,_float>_>
                             *)expression);
      } while (dimension < sVar6);
    }
    this_00 = *(View<float,_true,_std::allocator<unsigned_long>_> **)expression;
    *(size_t *)(this + 0x30) = (this_00->geometry_).size_;
    this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
    View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
    CVar1 = (this_00->geometry_).coordinateOrder_;
    *(CoordinateOrder *)(this + 0x38) = CVar1;
    lVar7 = *(long *)(this + 0x28);
    if (lVar7 != 0) {
      lVar2 = *(long *)(this + 0x10);
      plVar3 = *(long **)(this + 0x18);
      if (CVar1 == FirstMajorOrder) {
        plVar3[lVar7 + -1] = 1;
        if (lVar7 != 1) {
          lVar8 = plVar3[lVar7 + -1];
          do {
            lVar8 = lVar8 * *(long *)(lVar2 + -8 + lVar7 * 8);
            plVar3[lVar7 + -2] = lVar8;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 1);
        }
      }
      else {
        *plVar3 = 1;
        if (lVar7 != 1) {
          lVar8 = *plVar3;
          lVar9 = 0;
          do {
            lVar8 = lVar8 * *(long *)(lVar2 + lVar9 * 8);
            plVar3[lVar9 + 1] = lVar8;
            lVar9 = lVar9 + 1;
          } while (lVar7 + -1 != lVar9);
        }
      }
      lVar7 = *(long *)(this + 0x28);
      if (lVar7 == 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Assertion failed.");
LAB_00147844:
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar3 = *(long **)(this + 0x20);
      if (CVar1 == FirstMajorOrder) {
        plVar3[lVar7 + -1] = 1;
        if (lVar7 != 1) {
          lVar8 = plVar3[lVar7 + -1];
          do {
            lVar8 = lVar8 * *(long *)(lVar2 + -8 + lVar7 * 8);
            plVar3[lVar7 + -2] = lVar8;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 1);
        }
      }
      else {
        *plVar3 = 1;
        if (lVar7 != 1) {
          lVar8 = *plVar3;
          lVar9 = 0;
          do {
            lVar8 = lVar8 * *(long *)(lVar2 + lVar9 * 8);
            plVar3[lVar9 + 1] = lVar8;
            lVar9 = lVar9 + 1;
          } while (lVar7 + -1 != lVar9);
        }
      }
    }
    marray_detail::
    operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::DividedBy<float,float,float>>,float>
              (this,expression);
  }
  return (Marray<float,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

inline Marray<T, A>&
Marray<T, A>::operator=
(
    const ViewExpression<E, Te>& expression
)
{
    if(expression.overlaps(*this)) {
        Marray<T, A> m(expression); // temporary copy
        (*this) = m; // recursive call
    }
    else {
        // re-allocate memory (if necessary)
        if(this->size() != expression.size()) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = dataAllocator_.allocate(expression.size());
        }
        
        // copy geometry
        this->geometry_.resize(expression.dimension());
        for(std::size_t j=0; j<expression.dimension(); ++j) {
            this->geometry_.shape(j) = expression.shape(j);
        }
        this->geometry_.size() = expression.size();
        this->geometry_.isSimple() = true;
        this->geometry_.coordinateOrder() = expression.coordinateOrder();
        if(this->geometry_.dimension() != 0) {
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.shapeStridesBegin(), this->geometry_.coordinateOrder());
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.stridesBegin(), this->geometry_.coordinateOrder());
        }
        
        // copy data
        marray_detail::operate(*this, expression, marray_detail::Assign<T, Te>());
    }
    return *this;
}